

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

bool tchecker::syncprod::operator==(state_t *s1,state_t *s2)

{
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *a1;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *a2;
  bool bVar1;
  
  a1 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)(s1->_vloc)._t;
  if ((a1 != (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)0x0) &&
     (a2 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)(s2->_vloc)._t,
     a2 != (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)0x0)) {
    bVar1 = tchecker::operator==(a1,a2);
    return bVar1;
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,
                "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
               );
}

Assistant:

bool operator==(tchecker::syncprod::state_t const & s1, tchecker::syncprod::state_t const & s2)
{
  return (static_cast<tchecker::ts::state_t const &>(s1) == static_cast<tchecker::ts::state_t const &>(s2) &&
          s1.vloc() == s2.vloc());
}